

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O0

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *metrics)

{
  LOs *pLVar1;
  LO nmetrics;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar3;
  Reals RVar4;
  Read<double> local_140;
  Read<int> local_130;
  Read<double> local_120;
  Read<int> local_110;
  Read<double> local_100;
  Read<int> local_f0;
  Read<double> local_e0;
  Read<int> local_d0;
  Read<double> local_c0;
  Read<int> local_b0;
  Read<double> local_a0;
  int local_90;
  Int metric_dim;
  allocator local_79;
  string local_78 [32];
  initializer_list<double> local_58;
  Reals *local_48;
  Reals *metrics_local;
  LOs *a2e_local;
  Mesh *mesh_local;
  LOs *local_28;
  LOs *local_20;
  LOs *local_18;
  ulong local_10;
  
  if (((ulong)(a2e->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2e->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2e->write_).shared_alloc_.alloc >> 3;
  }
  local_48 = metrics;
  metrics_local = (Reals *)a2e;
  a2e_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  local_28 = a2e;
  local_20 = a2e;
  local_18 = a2e;
  if ((int)(local_10 >> 2) == 0) {
    std::initializer_list<double>::initializer_list(&local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    Read<double>::Read((Read<double> *)this,local_58,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pvVar3 = extraout_RDX;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    Read<double>::Read(&local_a0,metrics);
    IVar2 = get_metrics_dim(nmetrics,&local_a0);
    Read<double>::~Read(&local_a0);
    local_90 = IVar2;
    IVar2 = Mesh::dim((Mesh *)a2e_local);
    pLVar1 = a2e_local;
    if ((IVar2 == 3) && (local_90 == 3)) {
      Read<int>::Read(&local_b0,a2e);
      Read<double>::Read(&local_c0,metrics);
      measure_edges_metric_tmpl<3,3>(this,(Mesh *)pLVar1,&local_b0,&local_c0);
      Read<double>::~Read(&local_c0);
      Read<int>::~Read(&local_b0);
      pvVar3 = extraout_RDX_00;
    }
    else {
      IVar2 = Mesh::dim((Mesh *)a2e_local);
      pLVar1 = a2e_local;
      if ((IVar2 == 2) && (local_90 == 2)) {
        Read<int>::Read(&local_d0,a2e);
        Read<double>::Read(&local_e0,metrics);
        measure_edges_metric_tmpl<2,2>(this,(Mesh *)pLVar1,&local_d0,&local_e0);
        Read<double>::~Read(&local_e0);
        Read<int>::~Read(&local_d0);
        pvVar3 = extraout_RDX_01;
      }
      else {
        IVar2 = Mesh::dim((Mesh *)a2e_local);
        pLVar1 = a2e_local;
        if ((IVar2 == 3) && (local_90 == 1)) {
          Read<int>::Read(&local_f0,a2e);
          Read<double>::Read(&local_100,metrics);
          measure_edges_metric_tmpl<3,1>(this,(Mesh *)pLVar1,&local_f0,&local_100);
          Read<double>::~Read(&local_100);
          Read<int>::~Read(&local_f0);
          pvVar3 = extraout_RDX_02;
        }
        else {
          IVar2 = Mesh::dim((Mesh *)a2e_local);
          pLVar1 = a2e_local;
          if ((IVar2 == 2) && (local_90 == 1)) {
            Read<int>::Read(&local_110,a2e);
            Read<double>::Read(&local_120,metrics);
            measure_edges_metric_tmpl<2,1>(this,(Mesh *)pLVar1,&local_110,&local_120);
            Read<double>::~Read(&local_120);
            Read<int>::~Read(&local_110);
            pvVar3 = extraout_RDX_03;
          }
          else {
            IVar2 = Mesh::dim((Mesh *)a2e_local);
            pLVar1 = a2e_local;
            if ((IVar2 != 1) || (local_90 != 1)) {
              fail("assertion %s failed at %s +%d\n","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
                   ,0x24);
            }
            Read<int>::Read(&local_130,a2e);
            Read<double>::Read(&local_140,metrics);
            measure_edges_metric_tmpl<1,1>(this,(Mesh *)pLVar1,&local_130,&local_140);
            Read<double>::~Read(&local_140);
            Read<int>::~Read(&local_130);
            pvVar3 = extraout_RDX_04;
          }
        }
      }
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, LOs a2e, Reals metrics) {
  if (a2e.size() == 0) return Reals({});
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  if (mesh->dim() == 3 && metric_dim == 3) {
    return measure_edges_metric_tmpl<3, 3>(mesh, a2e, metrics);
  } else if (mesh->dim() == 2 && metric_dim == 2) {
    return measure_edges_metric_tmpl<2, 2>(mesh, a2e, metrics);
  } else if (mesh->dim() == 3 && metric_dim == 1) {
    return measure_edges_metric_tmpl<3, 1>(mesh, a2e, metrics);
  } else if (mesh->dim() == 2 && metric_dim == 1) {
    return measure_edges_metric_tmpl<2, 1>(mesh, a2e, metrics);
  } else if (mesh->dim() == 1 && metric_dim == 1) {
    return measure_edges_metric_tmpl<1, 1>(mesh, a2e, metrics);
  }
  OMEGA_H_NORETURN(Reals());
}